

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::AddColumnInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,AddColumnInfo *this)

{
  NotImplementedException *this_00;
  string *result;
  allocator local_41;
  string local_40;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,anon_var_dwarf_4b71df5 + 9,(allocator *)&local_40);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo.field_0xa == '\x01') {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ParseInfo::QualifierToString
            (&local_40,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (this->if_column_not_exists == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_40,"FIXME: column definition to string",&local_41)
  ;
  NotImplementedException::NotImplementedException(this_00,&local_40);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string AddColumnInfo::ToString() const {
	string result = "";
	result += "ALTER TABLE ";
	if (if_not_found == OnEntryNotFound::RETURN_NULL) {
		result += " IF EXISTS";
	}
	result += QualifierToString(catalog, schema, name);
	result += " ADD COLUMN";
	if (if_column_not_exists) {
		result += " IF NOT EXISTS";
	}
	throw NotImplementedException("FIXME: column definition to string");
	result += ";";
	return result;
}